

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.h
# Opt level: O2

void __thiscall
uWS::HttpContext<true>::onHttp
          (HttpContext<true> *this,string *method,string *pattern,
          unique_function<void_(HttpResponse<true>_*,_HttpRequest_*)> *handler,bool upgrade)

{
  bool bVar1;
  HttpContextData<false> *pHVar2;
  uint32_t priority;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  methods;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>
  local_a8;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<true>_*,_uWS::HttpRequest_*)>_>
  local_68;
  string local_48;
  
  pHVar2 = getSocketContextData(this);
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = std::operator==(method,"*");
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_c8,&(pHVar2->router).methods);
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,(string *)method);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
               &local_a8,local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_80,&local_c8);
  std::__cxx11::string::string((string *)&local_48,(string *)pattern);
  fu2::abi_400::detail::type_erasure::
  erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<true>_*,_uWS::HttpRequest_*)>_>
  ::erasure(&local_68,&handler->erasure_);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>
  ::
  function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_third_party_uWebSockets_src_HttpContext_h:362:55),_nullptr,_nullptr,_nullptr,_nullptr>
            ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>
              *)&local_a8,(anon_class_32_1_aca58a2a_for_value_ *)&local_68);
  bVar1 = std::operator==(method,"*");
  priority = 0xf0000000;
  if (!bVar1) {
    priority = (uint)!upgrade * 0x10000000 + 0xd0000000;
  }
  HttpRouter<uWS::HttpContextData<true>::RouterData>::add
            ((HttpRouter<uWS::HttpContextData<true>::RouterData> *)&pHVar2->router,&local_80,
             &local_48,(unique_function<bool_(HttpRouter<RouterData>_*)> *)&local_a8,priority);
  fu2::abi_400::detail::type_erasure::
  erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>
  ::~erasure(&local_a8);
  fu2::abi_400::detail::type_erasure::
  erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<true>_*,_uWS::HttpRequest_*)>_>
  ::~erasure(&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return;
}

Assistant:

void onHttp(std::string method, std::string pattern, fu2::unique_function<void(HttpResponse<SSL> *, HttpRequest *)> &&handler, bool upgrade = false) {
        HttpContextData<SSL> *httpContextData = getSocketContextData();

        /* Todo: This is ugly, fix */
        std::vector<std::string> methods;
        if (method == "*") {
            methods = httpContextData->router.methods;
        } else {
            methods = {method};
        }

        httpContextData->router.add(methods, pattern, [handler = std::move(handler)](auto *r) mutable {
            auto user = r->getUserData();
            user.httpRequest->setYield(false);
            user.httpRequest->setParameters(r->getParameters());

            /* Middleware? Automatically respond to expectations */
            std::string_view expect = user.httpRequest->getHeader("expect");
            if (expect.length() && expect == "100-continue") {
                user.httpResponse->writeContinue();
            }

            handler(user.httpResponse, user.httpRequest);

            /* If any handler yielded, the router will keep looking for a suitable handler. */
            if (user.httpRequest->getYield()) {
                return false;
            }
            return true;
        }, method == "*" ? httpContextData->router.LOW_PRIORITY : (upgrade ? httpContextData->router.HIGH_PRIORITY : httpContextData->router.MEDIUM_PRIORITY));
    }